

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeMahonyFilter.cpp
# Opt level: O2

Matrix3x3 *
getAngVelSkewSymmetricMatrixFromMeasurements
          (Matrix3x3 *__return_storage_ptr__,Vector3 meas,Direction *vectorDir,double confidenceMeas
          ,Rotation *R)

{
  RealScalar RVar1;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> S;
  Matrix3x3 Adyn;
  Direction va_hat;
  undefined1 local_118 [16];
  double local_108;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_f8 [2];
  double local_e8;
  double dStack_e0;
  double local_d8;
  Vector3 *local_d0 [9];
  Direction local_88;
  undefined1 local_70 [16];
  undefined1 *local_60;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *local_58;
  scalar_constant_op<double> local_38;
  
  iDynTree::Rotation::inverse();
  iDynTree::Rotation::changeCoordFrameOf(&local_88);
  local_d0[0] = &meas;
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
          norm((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)local_d0);
  if ((RVar1 != 1.0) || (NAN(RVar1))) {
    local_d0[0] = &meas;
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    normalize((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)local_d0);
  }
  local_70._0_8_ = &local_e8;
  local_d8 = meas.m_data[2];
  local_e8 = meas.m_data[0];
  dStack_e0 = meas.m_data[1];
  local_60 = local_118;
  local_108 = local_88.super_Vector3.m_data[2];
  local_118._0_8_ = local_88.super_Vector3.m_data[0];
  local_118._8_8_ = local_88.super_Vector3.m_data[1];
  local_f8[0] = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)local_d0;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>,0>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_f8,
             (Product<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
              *)local_70);
  local_38.m_other = confidenceMeas * 0.5;
  local_118._0_8_ = __return_storage_ptr__;
  local_70._8_8_ =
       (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *)
       local_d0;
  local_58 = (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_d0;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_118,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)local_70);
  return __return_storage_ptr__;
}

Assistant:

iDynTree::Matrix3x3 getAngVelSkewSymmetricMatrixFromMeasurements(iDynTree::Vector3 meas, const iDynTree::Direction& vectorDir, double confidenceMeas, const iDynTree::Rotation& R)
{
    using iDynTree::toEigen;

    ///< compute \f$ {{^A}{\hat{R}}_B}^T e_3 \f$ where \f$ e_3 \f$ is the vectorDir
    iDynTree::Direction va_hat = R.inverse().changeCoordFrameOf(vectorDir);
    iDynTree::Vector3 vectorial_estimate = iDynTree::Vector3(va_hat.data(), 3);

    ///< compute vectorial direction from the measurement normalized
    if (toEigen(meas).norm() != 1)
    {
        toEigen(meas).normalize();
    }

    iDynTree::Matrix3x3 Adyn = getMatrixFromVectorVectorMultiplication(meas, vectorial_estimate);
    iDynTree::Matrix3x3 Sdyn;
    auto A(toEigen(Adyn));
    auto S(toEigen(Sdyn));

    S = (A - A.transpose())*(confidenceMeas*0.5);

    return Sdyn;
}